

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgradientreconstruction.cpp
# Opt level: O0

void __thiscall
TPZGradientReconstruction::AssembleGlobalMatrix
          (TPZGradientReconstruction *this,TPZCompEl *el,TPZElementMatrix *ekb,TPZElementMatrix *efb
          ,TPZMatrix<double> *stiffmatrix,TPZFMatrix<double> *rhs)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  undefined8 in_RCX;
  TPZVec<long> *in_RDX;
  TPZVec<long> *in_RSI;
  TPZFMatrix<double> *in_RDI;
  long *in_R8;
  TPZFMatrix<double> *unaff_retaddr;
  TPZElementMatrixT<double> *ef;
  TPZElementMatrixT<double> *ek;
  TPZElementMatrix *in_stack_00000080;
  
  plVar2 = (long *)__dynamic_cast(in_RDX,&TPZElementMatrix::typeinfo,
                                  &TPZElementMatrixT<double>::typeinfo,0);
  if (plVar2 == (long *)0x0) {
    __cxa_bad_cast();
  }
  plVar3 = (long *)__dynamic_cast(in_RCX,&TPZElementMatrix::typeinfo,
                                  &TPZElementMatrixT<double>::typeinfo,0);
  if (plVar3 == (long *)0x0) {
    __cxa_bad_cast();
  }
  iVar1 = (*in_RSI->_vptr_TPZVec[0x3e])();
  if (iVar1 == 0) {
    TPZElementMatrix::ComputeDestinationIndices(in_stack_00000080);
    (**(code **)(*in_R8 + 0x1a0))(in_R8,plVar2 + 0x3e,plVar2 + 0x2d,plVar2 + 0x1f);
    TPZFMatrix<double>::AddFel(unaff_retaddr,in_RDI,in_RSI,in_RDX);
  }
  else {
    (**(code **)(*plVar2 + 0x30))();
    (**(code **)(*plVar3 + 0x30))();
    TPZElementMatrix::ComputeDestinationIndices(in_stack_00000080);
    (**(code **)(*in_R8 + 0x1a0))(in_R8,plVar2 + 0x453,plVar2 + 0x2d,plVar2 + 0x1f);
    TPZFMatrix<double>::AddFel(unaff_retaddr,in_RDI,in_RSI,in_RDX);
  }
  return;
}

Assistant:

void TPZGradientReconstruction::AssembleGlobalMatrix(TPZCompEl *el, TPZElementMatrix &ekb, TPZElementMatrix &efb,TPZMatrix<STATE> & stiffmatrix, TPZFMatrix<STATE> &rhs){
    //TODOCOMPLEX
    auto &ek =
		dynamic_cast<TPZElementMatrixT<STATE>&>(ekb);
	auto &ef =
		dynamic_cast<TPZElementMatrixT<STATE>&>(efb);
    if(!el->HasDependency()) {
        ek.ComputeDestinationIndices();
        
        stiffmatrix.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
        rhs.AddFel(ef.fMat,ek.fSourceIndex,ek.fDestinationIndex);
        
    } else {
        // the element has dependent nodes
        ek.ApplyConstraints();
        ef.ApplyConstraints();
        ek.ComputeDestinationIndices();
        
        stiffmatrix.AddKel(ek.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
        rhs.AddFel(ef.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
    }
}